

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_test_case_registry_impl.hpp
# Opt level: O0

void Catch::TestRegistry::sortTests
               (IConfig *config,
               vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *matchingTestCases)

{
  int iVar1;
  iterator iVar2;
  iterator __last;
  RandomNumberGenerator local_2a [2];
  RandomNumberGenerator rng;
  iterator iStack_28;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *matchingTestCases_local;
  IConfig *config_local;
  
  iVar1 = (*(config->super_IShared).super_NonCopyable._vptr_NonCopyable[0xe])();
  if (iVar1 != 0) {
    if (iVar1 == 1) {
      iVar2 = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                        (matchingTestCases);
      iStack_28 = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                            (matchingTestCases);
      std::
      sort<__gnu_cxx::__normal_iterator<Catch::TestCase*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>,Catch::TestRegistry::LexSort>
                (iVar2._M_current,iStack_28._M_current);
    }
    else if (iVar1 == 2) {
      iVar2 = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                        (matchingTestCases);
      __last = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                         (matchingTestCases);
      std::
      random_shuffle<__gnu_cxx::__normal_iterator<Catch::TestCase*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>,Catch::TestRegistry::RandomNumberGenerator&>
                ((__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                  )iVar2._M_current,
                 (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                  )__last._M_current,local_2a);
    }
  }
  return;
}

Assistant:

static void sortTests( IConfig const& config, std::vector<TestCase>& matchingTestCases ) {
            
            switch( config.runOrder() ) {
                case RunTests::InLexicographicalOrder:
                    std::sort( matchingTestCases.begin(), matchingTestCases.end(), LexSort() );
                    break;
                case RunTests::InRandomOrder:
                {
                    RandomNumberGenerator rng;
                    std::random_shuffle( matchingTestCases.begin(), matchingTestCases.end(), rng );
                }
                    break;
                case RunTests::InDeclarationOrder:
                    // already in declaration order
                    break;
            }
        }